

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

bool bradford_check(double a,double b,double c)

{
  char *pcVar1;
  
  if (b <= a) {
    pcVar1 = "  B <= A.\n";
  }
  else {
    if (0.0 < c) {
      return true;
    }
    pcVar1 = "  C <= 0.\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"BRADFORD_CHECK - Warning!\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,10);
  return false;
}

Assistant:

bool bradford_check ( double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    BRADFORD_CHECK checks the parameters of the Bradford PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    A < B,
//    0.0 < C.
//
//    Output, bool BRADFORD_CHECK, is true if the parameters are legal.
//
{
  if ( b <= a )
  {
    cerr << " \n";
    cerr << "BRADFORD_CHECK - Warning!\n";
    cerr << "  B <= A.\n";
    return false;
  }

  if ( c <= 0.0 )
  {
    cerr << " \n";
    cerr << "BRADFORD_CHECK - Warning!\n";
    cerr << "  C <= 0.\n";
    return false;
  }

  return true;
}